

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 floatx80_atanh_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  char cVar2;
  undefined1 auVar3 [12];
  uint64_t uVar4;
  uint uVar5;
  floatx80 fVar6;
  floatx80 fVar7;
  floatx80 fVar8;
  floatx80 b;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  
  fVar6.low = a.low;
  uVar5 = a._8_4_;
  if (((~uVar5 & 0x7fff) == 0) &&
     (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0)) {
    fVar6._8_8_ = a._8_8_ & 0xffffffff;
    fVar6 = propagateFloatx80NaNOneArg(fVar6,status);
    return fVar6;
  }
  fVar7._8_4_ = uVar5 & 0x7fff;
  if (fVar6.low == 0 && ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    uVar5 = uVar5 & 0x8000;
  }
  else {
    if (((uint)a.low._6_2_ | fVar7._8_4_ << 0x10) < 0x3fff8000) {
      cVar1 = status->float_rounding_mode;
      cVar2 = status->floatx80_rounding_precision;
      status->float_rounding_mode = '\0';
      status->floatx80_rounding_precision = 'P';
      fVar7.low = fVar6.low;
      fVar7._12_4_ = 0;
      a_00._8_4_ = fVar7._8_4_;
      a_00.low = fVar6.low;
      a_00._12_4_ = 0;
      fVar7 = floatx80_add_m68k(a_00,fVar7,status);
      b._8_8_ = 0x3fff;
      b.low = 0x8000000000000000;
      a_01._8_4_ = uVar5 | 0xffff8000;
      a_01.low = fVar6.low;
      a_01._12_4_ = 0;
      fVar6 = floatx80_add_m68k(a_01,b,status);
      b_00._8_8_ = fVar6._8_8_ & 0xffffffff;
      b_00.low = fVar6.low;
      auVar3 = fVar7._0_12_;
      a_02._12_4_ = 0;
      a_02.low = auVar3._0_8_;
      a_02.high = auVar3._8_2_;
      a_02._10_2_ = auVar3._10_2_;
      fVar6 = floatx80_div_m68k(a_02,b_00,status);
      auVar3 = fVar6._0_12_;
      a_03._12_4_ = 0;
      a_03.low = auVar3._0_8_;
      a_03.high = auVar3._8_2_;
      a_03._10_2_ = auVar3._10_2_;
      fVar6 = floatx80_lognp1_m68k(a_03,status);
      status->float_rounding_mode = cVar1;
      status->floatx80_rounding_precision = cVar2;
      b_01._8_4_ = uVar5 & 0xffff8000 | 0x3ffe;
      b_01.low = 0x8000000000000000;
      b_01._12_4_ = 0;
      auVar3 = fVar6._0_12_;
      a_04._12_4_ = 0;
      a_04.low = auVar3._0_8_;
      a_04.high = auVar3._8_2_;
      a_04._10_2_ = auVar3._10_2_;
      fVar6 = floatx80_mul_m68k(a_04,b_01,status);
      uVar4 = fVar6.low;
      uVar5 = fVar6._8_4_;
      float_raise_m68k(' ',status);
      goto LAB_006f3f6b;
    }
    if (fVar6.low != 0x8000000000000000 || fVar7._8_4_ != 0x3fff) {
      float_raise_m68k('\x01',status);
      fVar6 = floatx80_default_nan_m68k(status);
      return fVar6;
    }
    float_raise_m68k('\x04',status);
    uVar5 = (uint)(ushort)((a.high & 0x8000) + 0x7fff);
  }
  uVar4 = 0;
LAB_006f3f6b:
  fVar8._8_4_ = uVar5;
  fVar8.low = uVar4;
  fVar8._12_4_ = 0;
  return fVar8;
}

Assistant:

floatx80 floatx80_atanh(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    int8_t user_rnd_mode, user_rnd_prec;

    int32_t compact;
    floatx80 fp0, fp1, fp2, one;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF && (uint64_t) (aSig << 1)) {
        return propagateFloatx80NaNOneArg(a, status);
    }

    if (aExp == 0 && aSig == 0) {
        return packFloatx80(aSign, 0, 0);
    }

    compact = floatx80_make_compact(aExp, aSig);

    if (compact >= 0x3FFF8000) { /* |X| >= 1 */
        if (aExp == one_exp && aSig == one_sig) { /* |X| == 1 */
            float_raise(float_flag_divbyzero, status);
            return packFloatx80(aSign, floatx80_infinity.high,
                                floatx80_infinity.low);
        } else { /* |X| > 1 */
            float_raise(float_flag_invalid, status);
            return floatx80_default_nan(status);
        }
    } /* |X| < 1 */

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    one = packFloatx80(0, one_exp, one_sig);
    fp2 = packFloatx80(aSign, 0x3FFE, one_sig); /* SIGN(X) * (1/2) */
    fp0 = packFloatx80(0, aExp, aSig); /* Y = |X| */
    fp1 = packFloatx80(1, aExp, aSig); /* -Y */
    fp0 = floatx80_add(fp0, fp0, status); /* 2Y */
    fp1 = floatx80_add(fp1, one, status); /* 1-Y */
    fp0 = floatx80_div(fp0, fp1, status); /* Z = 2Y/(1-Y) */
    fp0 = floatx80_lognp1(fp0, status); /* LOG1P(Z) */

    status->float_rounding_mode = user_rnd_mode;
    status->floatx80_rounding_precision = user_rnd_prec;

    a = floatx80_mul(fp0, fp2,
                     status); /* ATANH(X) = SIGN(X) * (1/2) * LOG1P(Z) */

    float_raise(float_flag_inexact, status);

    return a;
}